

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_image_crop_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_rec crop,void *dst,rf_int dst_size,
          rf_uncompressed_pixel_format dst_format)

{
  rf_source_location source_location;
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  undefined8 in_R9;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  undefined8 uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  float fVar14;
  int width;
  uint height;
  float fVar15;
  float fVar16;
  float fVar17;
  
  uVar12 = crop._8_8_;
  fVar14 = crop.x;
  fVar17 = crop.y;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  if (image.valid == true) {
    if (fVar14 < 0.0) {
      uVar12 = CONCAT44(crop.height,fVar14 + crop.width);
      fVar14 = 0.0;
    }
    if (fVar17 < 0.0) {
      fVar15 = fVar17 + (float)((ulong)uVar12 >> 0x20);
      fVar17 = 0.0;
      uVar12 = CONCAT44(fVar15,(int)uVar12);
    }
    fVar15 = (float)image.width;
    if ((fVar14 < fVar15) && (fVar16 = (float)image.height, fVar17 < fVar16)) {
      if (fVar15 < fVar14 + (float)uVar12) {
        uVar12 = CONCAT44((int)((ulong)uVar12 >> 0x20),fVar15 - fVar14);
      }
      if (fVar16 < (float)((ulong)uVar12 >> 0x20) + fVar17) {
        uVar12 = CONCAT44(fVar16 - fVar17,(int)uVar12);
      }
      width = (int)(float)uVar12;
      height = (uint)(float)((ulong)uVar12 >> 0x20);
      uVar1 = rf_pixel_buffer_size(width,height,dst_format);
      if ((int)uVar1 <= dst_size) {
        iVar2 = rf_bytes_per_pixel(image.format);
        uVar4 = (long)width;
        if ((long)width < 1) {
          uVar4 = 0;
        }
        uVar7 = (ulong)height;
        if ((int)height < 1) {
          uVar7 = 0;
        }
        iVar10 = 0;
        iVar3 = ((int)fVar17 * image.width + (int)fVar14) * iVar2;
        for (uVar8 = 0; uVar11 = uVar4, iVar5 = iVar3, iVar9 = iVar10, uVar8 != uVar7;
            uVar8 = uVar8 + 1) {
          while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
            rf_format_one_pixel((void *)((long)image.data + (long)iVar5),image.format,
                                (void *)((long)dst + (long)iVar9),dst_format);
            iVar5 = iVar5 + iVar2;
            iVar9 = iVar9 + iVar2;
          }
          iVar3 = iVar3 + image.width * iVar2;
          iVar10 = iVar10 + width * iVar2;
        }
        __return_storage_ptr__->data = dst;
        __return_storage_ptr__->format = dst_format;
        __return_storage_ptr__->width = width;
        __return_storage_ptr__->height = height;
        __return_storage_ptr__->valid = true;
        return __return_storage_ptr__;
      }
      source_location.proc_name._0_4_ = 0x172eea;
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.proc_name._4_4_ = 0;
      source_location.line_in_file = 0x3dbb;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                  "Destination buffer is too small. Expected at least %d bytes but was %d",1,
                  (ulong)uVar1,dst_size,in_R9);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_image_crop_to_buffer";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3dbb;
      goto LAB_00126db2;
    }
    uVar12 = 0x3dbd;
    pcVar6 = "Image can not be cropped, crop rectangle out of bounds.";
  }
  else {
    uVar12 = 0x3dbf;
    pcVar6 = "Image is invalid.";
  }
  rf_log_impl(8,(rf_log_type)pcVar6,(char *)0x1);
  *(char **)(in_FS_OFFSET + -0x450) =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  *(char **)(in_FS_OFFSET + -0x448) = "rf_image_crop_to_buffer";
  *(undefined8 *)(in_FS_OFFSET + -0x440) = uVar12;
LAB_00126db2:
  *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_crop_to_buffer(rf_image image, rf_rec crop, void* dst, rf_int dst_size, rf_uncompressed_pixel_format dst_format)
{
    rf_image result = {0};

    if (image.valid)
    {
        // Security checks to validate crop rectangle
        if (crop.x < 0) { crop.width += crop.x; crop.x = 0; }
        if (crop.y < 0) { crop.height += crop.y; crop.y = 0; }
        if ((crop.x + crop.width) > image.width) { crop.width = image.width - crop.x; }
        if ((crop.y + crop.height) > image.height) { crop.height = image.height - crop.y; }

        if ((crop.x < image.width) && (crop.y < image.height))
        {
            int expected_size = rf_pixel_buffer_size(crop.width, crop.height, dst_format);
            if (dst_size >= expected_size)
            {
                rf_pixel_format src_format = image.format;
                int src_size = rf_image_size(image);

                unsigned char* src_ptr = image.data;
                unsigned char* dst_ptr = dst;

                int src_bpp = rf_bytes_per_pixel(image.format);
                int dst_bpp = rf_bytes_per_pixel(dst_format);

                int crop_y = crop.y;
                int crop_h = crop.height;
                int crop_x = crop.x;
                int crop_w = crop.width;

                for (rf_int y = 0; y < crop_h; y++)
                {
                    for (rf_int x = 0; x < crop_w; x++)
                    {
                        int src_x = x + crop_x;
                        int src_y = y + crop_y;

                        int src_pixel = (src_y * image.width + src_x) * src_bpp;
                        int dst_pixel = (y * crop_w + x) * src_bpp;
                        RF_ASSERT(src_pixel < src_size);
                        RF_ASSERT(dst_pixel < dst_size);

                        rf_format_one_pixel(&src_ptr[src_pixel], src_format, &dst_ptr[dst_pixel], dst_format);
                    }
                }

                result.data   = dst;
                result.format = dst_format;
                result.width  = crop.width;
                result.height = crop.height;
                result.valid  = true;
            }
            else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Destination buffer is too small. Expected at least %d bytes but was %d", expected_size, dst_size);
        }
        else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image can not be cropped, crop rectangle out of bounds.");
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image is invalid.");

    return result;
}